

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O1

void __thiscall kratos::HashVisitor::~HashVisitor(HashVisitor *this)

{
  pointer puVar1;
  
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002b5548;
  puVar1 = (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->stmt_hashes_).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar1 = (this->var_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->var_hashes_).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002b4da0;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->super_IRVisitor).visited_._M_h);
  operator_delete(this,0x88);
  return;
}

Assistant:

explicit HashVisitor(Generator* root) : root_(root) {
        context_ = root->context();
        // compute the hash for all vars
        auto vars = root->get_vars();
        var_hashes_.reserve(vars.size());
        for (const auto& var : vars) {
            uint64_t var_hash = hash_64_fnv1a(var.c_str(), var.size());
            var_hashes_.emplace_back(var_hash);
        }
    }